

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::BinaryExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *syntax_00;
  ExpressionSyntax *syntax_01;
  Type *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  bool bVar1;
  BinaryOperator op;
  Type *pTVar2;
  Expression *pEVar3;
  SourceLocation location;
  Diagnostic *pDVar4;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceRange opRange;
  SourceRange sourceRange;
  ConstantValue val;
  Expression *local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  extraFlags.m_bits = (ulong)((~(uint)(context->flags).m_bits & 0x600) == 0) << 9;
  syntax_00 = (syntax->left).ptr;
  syntax_01 = (syntax->right).ptr;
  op = OpInfo::getBinary((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  if (op - Equality < 4) {
    extraFlags.m_bits = extraFlags.m_bits | 0x8000;
    local_80 = Expression::tryBindInterfaceRef(context,syntax_00,false);
    if (local_80 == (Expression *)0x0) {
      local_80 = Expression::create(compilation,syntax_00,context,extraFlags,(Type *)0x0);
    }
    this = (local_80->type).ptr;
    pTVar2 = this->canonical;
    if (pTVar2 == (Type *)0x0) {
      Type::resolveCanonical(this);
      pTVar2 = this->canonical;
    }
    if (((pTVar2->super_Symbol).kind == VirtualInterfaceType) &&
       (pEVar3 = Expression::tryBindInterfaceRef(context,syntax_01,false),
       pEVar3 != (Expression *)0x0)) {
      if ((local_80->kind == ArbitrarySymbol) && (pEVar3->kind == ArbitrarySymbol)) {
        location = parsing::Token::location(&syntax->operatorToken);
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x360007,location);
        pDVar4 = Diagnostic::operator<<(pDVar4,local_80->sourceRange);
        Diagnostic::operator<<(pDVar4,pEVar3->sourceRange);
        pEVar3 = Expression::badExpr(compilation,(Expression *)0x0);
        return pEVar3;
      }
      goto LAB_0038798b;
    }
  }
  else {
    local_80 = Expression::create(compilation,syntax_00,context,extraFlags,(Type *)0x0);
    bVar1 = OpInfo::isShortCircuit(op);
    if (bVar1) {
      ASTContext::tryEval((ConstantValue *)&local_58,context,local_80);
      if (local_58._M_index != '\0') {
        if (op == LogicalOr) {
          bVar1 = ConstantValue::isTrue((ConstantValue *)&local_58);
        }
        else {
          bVar1 = ConstantValue::isFalse((ConstantValue *)&local_58);
        }
        if (bVar1 != false) {
          extraFlags.m_bits = extraFlags.m_bits | 2;
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
    }
  }
  pEVar3 = Expression::create(compilation,syntax_01,context,extraFlags,(Type *)0x0);
LAB_0038798b:
  opRange = parsing::Token::range(&syntax->operatorToken);
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pEVar3 = fromComponents(local_80,pEVar3,op,opRange,sourceRange,context);
  syntax_02._M_ptr =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_02._M_extent._M_extent_value =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ASTContext::setAttributes(context,pEVar3,syntax_02);
  return pEVar3;
}

Assistant:

Expression& BinaryExpression::fromSyntax(Compilation& compilation,
                                         const BinaryExpressionSyntax& syntax,
                                         const ASTContext& context) {
    // If we are allowed unbounded literals here, pass that along to subexpressions.
    bitmask<ASTFlags> flags = ASTFlags::None;
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        flags = ASTFlags::AllowUnboundedLiteral;
    }

    Expression *lhs, *rhs;
    auto& syntaxLeft = *syntax.left;
    auto& syntaxRight = *syntax.right;

    auto op = OpInfo::getBinary(syntax.kind);
    if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality ||
        op == BinaryOperator::CaseEquality || op == BinaryOperator::CaseInequality) {
        flags |= ASTFlags::AllowTypeReferences;

        // Special case to handle comparing a virtual interface with an
        // actual instance. We can't normally bind to an instance from
        // an expression so we need to explicitly try that separately here.
        lhs = tryBindInterfaceRef(context, syntaxLeft, /* isInterfacePort */ false);
        if (!lhs)
            lhs = &create(compilation, syntaxLeft, context, flags);

        // If we found a virtual interface on the lhs we can also try for an instance
        // on the rhs. Otherwise we know we're doing normal expression binding.
        if (lhs->type->isVirtualInterface()) {
            rhs = tryBindInterfaceRef(context, syntaxRight, /* isInterfacePort */ false);
            if (!rhs) {
                rhs = &create(compilation, syntaxRight, context, flags);
            }
            else if (lhs->kind == ExpressionKind::ArbitrarySymbol &&
                     rhs->kind == ExpressionKind::ArbitrarySymbol) {
                // Having an instance on both sides is not allowed. One side must be
                // an actual virtual interface.
                context.addDiag(diag::CannotCompareTwoInstances, syntax.operatorToken.location())
                    << lhs->sourceRange << rhs->sourceRange;
                return badExpr(compilation, nullptr);
            }
        }
        else {
            rhs = &create(compilation, syntaxRight, context, flags);
        }
    }
    else {
        lhs = &create(compilation, syntaxLeft, context, flags);

        if (OpInfo::isShortCircuit(op)) {
            // We want to evaluate the lhs as a constant if possible, to know whether
            // the rhs is for sure in an unevaluated context. This is required for
            // correctness in cases where the condition on the lhs gates off otherwise
            // invalid code on the rhs.
            if (auto val = context.tryEval(*lhs)) {
                switch (op) {
                    case BinaryOperator::LogicalAnd:
                    case BinaryOperator::LogicalImplication:
                        if (val.isFalse())
                            flags |= ASTFlags::UnevaluatedBranch;
                        break;
                    case BinaryOperator::LogicalOr:
                        if (val.isTrue())
                            flags |= ASTFlags::UnevaluatedBranch;
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        rhs = &create(compilation, syntaxRight, context, flags);
    }

    auto& result = fromComponents(*lhs, *rhs, op, syntax.operatorToken.range(),
                                  syntax.sourceRange(), context);
    context.setAttributes(result, syntax.attributes);

    return result;
}